

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperOpFailure<void*,Struct2*>
          (internal *this,char *expr1,char *expr2,void **val1,Struct2 **val2,char *op)

{
  AssertionResult *pAVar1;
  void **value;
  Struct2 **value_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  long in_FS_OFFSET;
  AssertionResult AVar2;
  AssertionResult local_90;
  char *local_80;
  char *local_78;
  char *local_70;
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = op;
  local_78 = expr2;
  local_70 = expr1;
  AssertionFailure();
  pAVar1 = AssertionResult::operator<<(&local_90,(char (*) [12])"Expected: (");
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_70);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])") ");
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_80);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])0x16844d);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_78);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [12])"), actual: ");
  PrintToString<void*>(&local_48,(testing *)val1,value);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_48);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" vs ");
  PrintToString<Struct2*>(&local_68,(testing *)val2,value_00);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_68);
  AssertionResult::AssertionResult((AssertionResult *)this,pAVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_90.message_);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    AVar2.message_.ptr_ = extraout_RDX.ptr_;
    AVar2._0_8_ = this;
    return AVar2;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2,
                                   const T1& val1, const T2& val2,
                                   const char* op) {
  return AssertionFailure()
         << "Expected: (" << expr1 << ") " << op << " (" << expr2
         << "), actual: " << FormatForComparisonFailureMessage(val1, val2)
         << " vs " << FormatForComparisonFailureMessage(val2, val1);
}